

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

uint __thiscall TArray<line_t,_line_t>::Push(TArray<line_t,_line_t> *this,line_t_conflict *item)

{
  uint uVar1;
  line_t_conflict *item_local;
  TArray<line_t,_line_t> *this_local;
  
  Grow(this,1);
  line_t::line_t((line_t *)(this->Array + this->Count),item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}